

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O0

void __thiscall level_info_t::level_info_t(level_info_t *this)

{
  level_info_t *this_local;
  
  FString::FString(&this->MapName);
  FString::FString(&this->NextMap);
  FString::FString(&this->NextSecretMap);
  FString::FString(&this->PName);
  FString::FString(&this->SkyPic1);
  FString::FString(&this->SkyPic2);
  FString::FString(&this->FadeTable);
  FString::FString(&this->F1Pic);
  FString::FString(&this->BorderTexture);
  FString::FString(&this->MapBackground);
  FString::FString(&this->Music);
  FString::FString(&this->LevelName);
  FString::FString(&this->Translator);
  FName::FName(&this->Intermission);
  FName::FName(&this->deathsequence);
  FName::FName(&this->slideshow);
  FName::FName(&this->RedirectType);
  FString::FString(&this->RedirectMapName);
  FString::FString(&this->EnterPic);
  FString::FString(&this->ExitPic);
  FString::FString(&this->InterMusic);
  FString::FString(&this->SoundInfo);
  FString::FString(&this->SndSeq);
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
  TMap(&this->optdata);
  TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::TMap(&this->MusicMap);
  TArray<FSpecialAction,_FSpecialAction>::TArray(&this->specialactions);
  TArray<FSoundID,_FSoundID>::TArray(&this->PrecacheSounds);
  TArray<FString,_FString>::TArray(&this->PrecacheTextures);
  TArray<FName,_FName>::TArray(&this->PrecacheClasses);
  Reset(this);
  return;
}

Assistant:

level_info_t() 
	{ 
		Reset(); 
	}